

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::
argument_loader<LongReadsMapper*,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>const&>
::load_impl_sequence<0ul,1ul>
          (argument_loader<LongReadsMapper*,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>const&>
           *this,long call)

{
  handle hVar1;
  bool bVar2;
  bool bVar3;
  reference rVar4;
  
  hVar1.m_ptr = (PyObject *)**(undefined8 **)(call + 8);
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)(call + 0x20),0);
  bVar2 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x38),hVar1,(*rVar4._M_p & rVar4._M_mask) != 0);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8);
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)(call + 0x20),1);
  bVar3 = set_caster<std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_unsigned_int>
          ::load((set_caster<std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_unsigned_int>
                  *)this,hVar1,(*rVar4._M_p & rVar4._M_mask) != 0);
  return bVar3 && bVar2;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }